

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intDup.c
# Opt level: O0

Aig_Man_t * Inter_ManStartInitState(int nRegs)

{
  Aig_Obj_t **pArgs;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar1;
  int local_2c;
  int i;
  Aig_Obj_t **ppInputs;
  Aig_Obj_t *pRes;
  Aig_Man_t *p;
  int nRegs_local;
  
  if (nRegs < 1) {
    __assert_fail("nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/int/intDup.c"
                  ,0x33,"Aig_Man_t *Inter_ManStartInitState(int)");
  }
  pArgs = (Aig_Obj_t **)malloc((long)nRegs << 3);
  p_00 = Aig_ManStart(nRegs);
  for (local_2c = 0; local_2c < nRegs; local_2c = local_2c + 1) {
    pAVar1 = Aig_ObjCreateCi(p_00);
    pAVar1 = Aig_Not(pAVar1);
    pArgs[local_2c] = pAVar1;
  }
  pAVar1 = Aig_Multi(p_00,pArgs,nRegs,AIG_OBJ_AND);
  Aig_ObjCreateCo(p_00,pAVar1);
  if (pArgs != (Aig_Obj_t **)0x0) {
    free(pArgs);
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create trivial AIG manager for the init state.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Inter_ManStartInitState( int nRegs )
{
    Aig_Man_t * p;
    Aig_Obj_t * pRes;
    Aig_Obj_t ** ppInputs;
    int i;
    assert( nRegs > 0 );
    ppInputs = ABC_ALLOC( Aig_Obj_t *, nRegs );
    p = Aig_ManStart( nRegs );
    for ( i = 0; i < nRegs; i++ )
        ppInputs[i] = Aig_Not( Aig_ObjCreateCi(p) );
    pRes = Aig_Multi( p, ppInputs, nRegs, AIG_OBJ_AND );
    Aig_ObjCreateCo( p, pRes );
    ABC_FREE( ppInputs );
    return p;
}